

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<14,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_3> *mat;
  VecAccess<float,_4,_3> local_b0;
  Matrix<float,_3,_3> local_94;
  Vector<float,_3> local_70 [2];
  Vector<float,_3> local_54;
  Vector<float,_3> local_48;
  undefined1 local_3c [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[1] = (float)in1Type;
  in0.m_data.m_data[2].m_data[2] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              ((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,9>
              ((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  reduceToVec3((MatrixCaseUtils *)&local_54,(Mat3 *)local_3c);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,3>
            (&local_94,(MatrixCaseUtils *)local_3c,mat);
  reduceToVec3((MatrixCaseUtils *)local_70,&local_94);
  tcu::operator+((tcu *)&local_48,&local_54,local_70);
  tcu::Vector<float,_4>::xyz(&local_b0,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_b0,&local_48);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_94);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}